

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O3

void __thiscall RegionChecker::printRange(RegionChecker *this,int from,int to)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  
  if (to - from != 0 && from <= to) {
    uVar4 = (ulong)from;
    do {
      iVar1 = (int)uVar4;
      iVar5 = iVar1 + 0x3f;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      if (((this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [(long)(iVar5 >> 6) +
            (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar4 & 0x3f) & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size: ",6);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,to - from);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," Start: ",8);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,from);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," End: ",6);
        plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,to);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        return;
      }
      uVar4 = uVar4 + 1;
    } while ((long)to != uVar4);
  }
  return;
}

Assistant:

void RegionChecker::printRange(int from, int to) const {
	for (int i = from; i < to; i++) {
		if (fileUsage[i]) {
			goto nonzero;
		}
	}
	return;
nonzero:
	std::cout << "Size: " << (to - from) << " Start: " << from << " End: " << to << std::endl;
}